

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_get_accumulate_
               (void *origin_addr,MPIABI_Fint *origin_count,MPIABI_Fint *origin_datatype,
               void *result_addr,MPIABI_Fint *result_count,MPIABI_Fint *result_datatype,
               MPIABI_Fint *target_rank,MPIABI_Fint *target_disp,MPIABI_Fint *target_count,
               MPIABI_Fint *target_datatype,MPIABI_Fint *op,MPIABI_Fint *win,MPIABI_Fint *ierror)

{
  MPIABI_Fint *result_datatype_local;
  MPIABI_Fint *result_count_local;
  void *result_addr_local;
  MPIABI_Fint *origin_datatype_local;
  MPIABI_Fint *origin_count_local;
  void *origin_addr_local;
  
  mpi_get_accumulate_(origin_addr,origin_count,origin_datatype,result_addr,result_count,
                      result_datatype,target_rank,target_disp,target_count,target_datatype,op,win,
                      ierror);
  return;
}

Assistant:

void mpiabi_get_accumulate_(
  const void * origin_addr,
  const MPIABI_Fint * origin_count,
  const MPIABI_Fint * origin_datatype,
  void * result_addr,
  const MPIABI_Fint * result_count,
  const MPIABI_Fint * result_datatype,
  const MPIABI_Fint * target_rank,
  const MPIABI_Fint * target_disp,
  const MPIABI_Fint * target_count,
  const MPIABI_Fint * target_datatype,
  const MPIABI_Fint * op,
  const MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_get_accumulate_(
    origin_addr,
    origin_count,
    origin_datatype,
    result_addr,
    result_count,
    result_datatype,
    target_rank,
    target_disp,
    target_count,
    target_datatype,
    op,
    win,
    ierror
  );
}